

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

int secp256k1_fe_equal_var(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  secp256k1_fe *in_RSI;
  secp256k1_fe *in_RDI;
  secp256k1_fe na;
  secp256k1_fe sStack_38;
  secp256k1_fe *local_10;
  
  local_10 = in_RSI;
  secp256k1_fe_impl_negate_unchecked(&sStack_38,in_RDI,1);
  secp256k1_fe_impl_add(&sStack_38,local_10);
  iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&sStack_38);
  return iVar1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal_var(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
#ifdef VERIFY
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(b);
    VERIFY_CHECK(a->magnitude <= 1);
    VERIFY_CHECK(b->magnitude <= 31);
#endif
    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero_var(&na);
}